

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

void __thiscall S2Polygon::Invert(S2Polygon *this)

{
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  *this_00;
  int *piVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer puVar6;
  int i_1;
  pointer puVar7;
  _Head_base<0UL,_S2Loop_*,_false> this_01;
  int i;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  new_loops;
  S2LogMessage local_48;
  double local_38;
  
  this_00 = &this->loops_;
  if ((this->loops_).
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->loops_).
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    S2Loop::kFull();
    absl::make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
              ((absl *)&local_48,
               (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&new_loops);
    std::
    vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
    ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
              ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                *)this_00,(unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)&local_48);
    std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr
              ((unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)&local_48);
    std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base
              ((_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&new_loops);
  }
  else {
    bVar3 = is_full(this);
    if (bVar3) {
      ClearLoops(this);
    }
    else {
      dVar11 = 10.0;
      iVar5 = 0;
      lVar8 = 1;
      while( true ) {
        puVar7 = (this->loops_).
                 super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)iVar5;
        if ((int)((ulong)((long)(this->loops_).
                                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar7) >> 3) <=
            lVar8) break;
        this_01._M_head_impl =
             *(S2Loop **)
              &puVar7[lVar8]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
        if (*(int *)((long)this_01._M_head_impl + 8) == 0) {
          if ((dVar11 == 10.0) && (!NAN(dVar11))) {
            dVar11 = S2Loop::GetCurvature
                               ((S2Loop *)
                                puVar7[lVar10]._M_t.
                                super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t);
            this_01._M_head_impl =
                 *(S2Loop **)
                  &(this_00->
                   super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t.
                   super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
          }
          dVar12 = S2Loop::GetCurvature(this_01._M_head_impl);
          if (dVar11 <= dVar12) {
            if ((dVar12 == dVar11) && (!NAN(dVar12) && !NAN(dVar11))) {
              puVar7 = (this_00->
                       super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_38 = dVar12;
              iVar4 = CompareLoops((S2Loop *)
                                   puVar7[lVar8]._M_t.
                                   super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>,
                                   (S2Loop *)
                                   puVar7[lVar10]._M_t.
                                   super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>);
              dVar12 = local_38;
              if (iVar4 < 0) goto LAB_00244ff5;
            }
          }
          else {
LAB_00244ff5:
            dVar11 = dVar12;
            iVar5 = (int)lVar8;
          }
        }
        lVar8 = lVar8 + 1;
      }
      S2Loop::Invert((S2Loop *)
                     puVar7[lVar10]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>
                     ._M_t);
      new_loops.
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_loops.
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      new_loops.
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ::reserve(&new_loops,
                (long)(int)((ulong)((long)(this->loops_).
                                          super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->loops_).
                                         super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
      iVar5 = GetLastDescendant(this,iVar5);
      std::
      vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
      ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
                ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                  *)&new_loops,
                 (this->loops_).
                 super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar10);
      lVar9 = 0;
      lVar8 = 0;
      while( true ) {
        puVar7 = (this->loops_).
                 super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar6 = (this->loops_).
                 super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((int)((ulong)((long)puVar6 - (long)puVar7) >> 3) <= lVar8) break;
        if (lVar8 < lVar10 || iVar5 < lVar8) {
          piVar1 = (int *)(*(long *)((long)&(puVar7->_M_t).
                                            super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>
                                            .super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl +
                                    lVar9) + 8);
          *piVar1 = *piVar1 + 1;
          std::
          vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
          ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
                    ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                      *)&new_loops,
                     (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)
                     ((long)&(puVar7->_M_t).
                             super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
                             super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                             super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + lVar9));
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 8;
      }
      lVar9 = 0;
      for (lVar8 = 0; lVar8 < (int)((ulong)((long)puVar6 - (long)puVar7) >> 3); lVar8 = lVar8 + 1) {
        if (lVar8 <= iVar5 && lVar10 < lVar8) {
          piVar1 = (int *)(*(long *)((long)&(puVar7->_M_t).
                                            super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>
                                            .super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl +
                                    lVar9) + 8);
          *piVar1 = *piVar1 + -1;
          std::
          vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
          ::emplace_back<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>
                    ((vector<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>,std::allocator<std::unique_ptr<S2Loop,std::default_delete<S2Loop>>>>
                      *)&new_loops,
                     (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)
                     ((long)&(puVar7->_M_t).
                             super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
                             super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                             super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + lVar9));
          puVar7 = (this->loops_).
                   super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar6 = (this->loops_).
                   super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        lVar9 = lVar9 + 8;
      }
      puVar2 = (this->loops_).
               super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->loops_).
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           new_loops.
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->loops_).
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           new_loops.
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (this->loops_).
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           new_loops.
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      new_loops.
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar2;
      if ((long)puVar6 - (long)puVar7 >> 3 !=
          (long)(int)((ulong)((long)new_loops.
                                    super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)new_loops.
                                   super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        new_loops.
        super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = puVar7;
        new_loops.
        super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar6;
        S2LogMessage::S2LogMessage
                  (&local_48,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
                   ,0x357,kFatal,(ostream *)&std::cerr);
        std::operator<<(local_48.stream_,"Check failed: (new_loops.size()) == (num_loops()) ");
        abort();
      }
      new_loops.
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar7;
      new_loops.
      super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar6;
      std::
      vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
      ::~vector(&new_loops);
    }
  }
  ClearIndex(this);
  InitLoopProperties(this);
  return;
}

Assistant:

void S2Polygon::Invert() {
  // Inverting any one loop will invert the polygon.  The best loop to invert
  // is the one whose area is largest, since this yields the smallest area
  // after inversion.  The loop with the largest area is always at depth 0.
  // The descendents of this loop all have their depth reduced by 1, while the
  // former siblings of this loop all have their depth increased by 1.

  // The empty and full polygons are handled specially.
  if (is_empty()) {
    loops_.push_back(make_unique<S2Loop>(S2Loop::kFull()));
  } else if (is_full()) {
    ClearLoops();
  } else {
    // Find the loop whose area is largest (i.e., whose curvature is
    // smallest), minimizing calls to GetCurvature().  In particular, for
    // polygons with a single shell at level 0 there is not need to call
    // GetCurvature() at all.  (This method is relatively expensive.)
    int best = 0;
    const double kNone = 10.0;  // Flag that means "not computed yet"
    double best_angle = kNone;
    for (int i = 1; i < num_loops(); ++i) {
      if (loop(i)->depth() == 0) {
        // We defer computing the curvature of loop 0 until we discover
        // that the polygon has another top-level shell.
        if (best_angle == kNone) best_angle = loop(best)->GetCurvature();
        double angle = loop(i)->GetCurvature();
        // We break ties deterministically in order to avoid having the output
        // depend on the input order of the loops.
        if (angle < best_angle ||
            (angle == best_angle && CompareLoops(loop(i), loop(best)) < 0)) {
          best = i;
          best_angle = angle;
        }
      }
    }
    // Build the new loops vector, starting with the inverted loop.
    loop(best)->Invert();
    vector<unique_ptr<S2Loop>> new_loops;
    new_loops.reserve(num_loops());
    // Add the former siblings of this loop as descendants.
    int last_best = GetLastDescendant(best);
    new_loops.push_back(std::move(loops_[best]));
    for (int i = 0; i < num_loops(); ++i) {
      if (i < best || i > last_best) {
        loop(i)->set_depth(loop(i)->depth() + 1);
        new_loops.push_back(std::move(loops_[i]));
      }
    }
    // Add the former children of this loop as siblings.
    for (int i = 0; i < num_loops(); ++i) {
      if (i > best && i <= last_best) {
        loop(i)->set_depth(loop(i)->depth() - 1);
        new_loops.push_back(std::move(loops_[i]));
      }
    }
    loops_.swap(new_loops);
    S2_DCHECK_EQ(new_loops.size(), num_loops());
  }
  ClearIndex();
  InitLoopProperties();
}